

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

void __thiscall Problem_CGBG_FF::AddEdge(Problem_CGBG_FF *this,Index hI)

{
  Scope *s;
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems;
  ulong uVar7;
  size_type __n;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> types_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions_e;
  stringstream ss;
  allocator_type local_211;
  double local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  undefined1 local_1e8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  value_type_conflict1 local_1b8 [4];
  ostream local_1a8 [376];
  
  uVar7 = (ulong)hI;
  pSVar1 = (this->_m_agentsForHouse_action).super__Vector_base<Scope,_std::allocator<Scope>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->_m_agentsForHouse_action).super__Vector_base<Scope,_std::allocator<Scope>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
          -0x5555555555555555;
  if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
  }
  s = pSVar1 + uVar7;
  BayesianGameCollaborativeGraphical::AddLRF(&this->super_BayesianGameCollaborativeGraphical,s);
  __n = (long)(s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start >> 2;
  local_1b8[0] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1d0,__n,local_1b8,(allocator_type *)&local_200);
  iVar3 = (*(this->super_BayesianGameCollaborativeGraphical).
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x23])(this,(ulong)hI);
  local_208 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(extraout_var,iVar3);
  local_1b8[0] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_200,__n,local_1b8,&local_211);
  iVar3 = (*(this->super_BayesianGameCollaborativeGraphical).
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x23])(this,(ulong)hI);
  local_208 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)local_208 + 0x80);
  nrElems = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (CONCAT44(extraout_var_00,iVar3) + 0x98);
  local_210 = 0.0;
  do {
    dVar9 = ComputeLocalProbability(this,s,&local_200);
    local_1e8._0_8_ = dVar9;
    (*(this->super_BayesianGameCollaborativeGraphical).super_BayesianGameIdenticalPayoffInterface.
      super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
      super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x1d])
              (dVar9,this,(ulong)hI,&local_200);
    bVar2 = IndexTools::Increment(&local_200,nrElems);
    local_210 = local_210 + (double)local_1e8._0_8_;
  } while (!bVar2);
  auVar8._8_8_ = 0x7fffffffffffffff;
  auVar8._0_8_ = 0x7fffffffffffffff;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_210 + -1.0;
  auVar8 = vandpd_avx512vl(auVar10,auVar8);
  if (auVar8._0_8_ < 1e-06) {
    do {
      do {
        ComputeLocalUtility(this,hI,s,&local_1d0,&local_200);
        (*(this->super_BayesianGameCollaborativeGraphical).
          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x22])(this,(ulong)hI,&local_200,&local_1d0);
        bVar2 = IndexTools::Increment(&local_200,nrElems);
      } while (!bVar2);
      bVar2 = IndexTools::Increment(&local_1d0,local_208);
    } while (!bVar2);
    if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  local_1e8 = auVar8;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Joint type probabilities for house ",0x23);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," do not sum to 1.0, but to ",0x1b);
  poVar4 = std::ostream::_M_insert<double>(local_210);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", a difference of ",0x12);
  poVar4 = std::ostream::_M_insert<double>((double)local_1e8._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!",1);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

void Problem_CGBG_FF::AddEdge(Index hI)
{
    const Scope & tupleOfAgents = _m_agentsForHouse_action.at(hI);
#if DEBUGADDEDGE     
    cout << "-------------------------------------"<<endl;
    cout << "Adding payoff component for house "<< hI  << endl
        << "\tscope="<< tupleOfAgents << endl;
    cout << "nr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
#endif
    AddLRF(tupleOfAgents);
    //Index e=GetNrLRFs()-1;
    Index e=hI;
    size_t k = tupleOfAgents.size();
    vector<Index> actions_e(k, 0);
    const vector<size_t>& nr_actions = GetBGIPforLRF(e)->GetNrActions();
    vector<Index> types_e(k, 0);
    const vector<size_t>& nr_types = GetBGIPforLRF(e)->GetNrTypes();

#if DEBUGADDEDGE     
    cout<< "\tnr_actions=" << PrintTools::SoftPrintVector(nr_actions) << endl
        << "\tnr_types=" << PrintTools::SoftPrintVector(nr_types) << endl;
    cout << "-------------------------------------"<<endl;
#endif
    double psum = 0.0;
    do{
#if DEBUGPROBS        
        cout << "Computing local type prob. P(" << PrintTools::SoftPrintVector(types_e) << ")..."<<endl;
#endif
        double p = ComputeLocalProbability(tupleOfAgents, types_e);
#if DEBUGPROBS        
        cout << "...P(" << PrintTools::SoftPrintVector(types_e) << ")="<<p<<endl;
#endif
        psum += p;
        SetProbability(e, types_e, p);
    }while(!IndexTools::Increment(types_e, nr_types));
    if(! (abs(psum-1.0)<1e-6))
    {
        stringstream ss;
        ss << "Joint type probabilities for house "<<hI<<" do not sum to 1.0, but to " 
            << psum << ", a difference of " << abs(psum-1) << "!";
        throw E(ss);
    }
    do{
        do{
            SetUtility(e, types_e, actions_e, ComputeLocalUtility(hI, tupleOfAgents,  actions_e, types_e));
        }while(!IndexTools::Increment(types_e, nr_types));
    }while(!IndexTools::Increment(actions_e, nr_actions));
}